

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O1

int KINInit(void *kinmem,KINSysFn func,N_Vector tmpl)

{
  N_Vector_Ops p_Var1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  void *pvVar5;
  long lVar6;
  code *pcVar7;
  long *plVar8;
  int line;
  int iVar9;
  int error_code;
  char *msgfmt;
  bool bVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  sunindextype lrw1;
  sunindextype liw1;
  undefined8 local_40;
  undefined8 local_38;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar9 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x14d;
LAB_00108d2c:
    KINProcessError((KINMem)kinmem,error_code,line,"KINInit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                    ,msgfmt);
    return iVar9;
  }
  if (func == (KINSysFn)0x0) {
    msgfmt = "func = NULL illegal.";
    iVar9 = -2;
    error_code = -2;
    line = 0x156;
    goto LAB_00108d2c;
  }
  p_Var1 = tmpl->ops;
  if ((((((p_Var1->nvclone == (_func_N_Vector_N_Vector *)0x0) ||
         (p_Var1->nvdestroy == (_func_void_N_Vector *)0x0)) ||
        (p_Var1->nvlinearsum == (_func_void_sunrealtype_N_Vector_sunrealtype_N_Vector_N_Vector *)0x0
        )) || ((p_Var1->nvprod == (_func_void_N_Vector_N_Vector_N_Vector *)0x0 ||
               (p_Var1->nvdiv == (_func_void_N_Vector_N_Vector_N_Vector *)0x0)))) ||
      ((p_Var1->nvscale == (_func_void_sunrealtype_N_Vector_N_Vector *)0x0 ||
       ((p_Var1->nvabs == (_func_void_N_Vector_N_Vector *)0x0 ||
        (p_Var1->nvinv == (_func_void_N_Vector_N_Vector *)0x0)))))) ||
     ((p_Var1->nvmaxnorm == (_func_sunrealtype_N_Vector *)0x0 ||
      ((p_Var1->nvmin == (_func_sunrealtype_N_Vector *)0x0 ||
       (p_Var1->nvwl2norm == (_func_sunrealtype_N_Vector_N_Vector *)0x0)))))) {
    msgfmt = "A required vector operation is not implemented.";
    iVar9 = -2;
    error_code = -2;
    line = 0x161;
    goto LAB_00108d2c;
  }
  if (p_Var1->nvspace == (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
    *(undefined1 (*) [16])((long)kinmem + 0x200) = (undefined1  [16])0x0;
  }
  else {
    N_VSpace(tmpl,&local_40,&local_38);
    *(undefined8 *)((long)kinmem + 0x200) = local_40;
    *(undefined8 *)((long)kinmem + 0x208) = local_38;
  }
  if (*(long *)((long)kinmem + 0x110) == 0) {
    lVar4 = N_VClone(tmpl);
    *(long *)((long)kinmem + 0x110) = lVar4;
    if (lVar4 == 0) goto LAB_001093a8;
    *(long *)((long)kinmem + 0x210) =
         *(long *)((long)kinmem + 0x210) + *(long *)((long)kinmem + 0x200);
    *(long *)((long)kinmem + 0x218) =
         *(long *)((long)kinmem + 0x218) + *(long *)((long)kinmem + 0x208);
  }
  if (*(long *)((long)kinmem + 0x118) == 0) {
    lVar4 = N_VClone(tmpl);
    *(long *)((long)kinmem + 0x118) = lVar4;
    if (lVar4 != 0) {
      *(long *)((long)kinmem + 0x210) =
           *(long *)((long)kinmem + 0x210) + *(long *)((long)kinmem + 0x200);
      *(long *)((long)kinmem + 0x218) =
           *(long *)((long)kinmem + 0x218) + *(long *)((long)kinmem + 0x208);
      goto LAB_00108dcc;
    }
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
    lVar4 = *(long *)((long)kinmem + 0x200);
    lVar6 = *(long *)((long)kinmem + 0x208);
    lVar13 = *(long *)((long)kinmem + 0x210);
    lVar14 = *(long *)((long)kinmem + 0x218);
LAB_0010939c:
    lVar13 = lVar13 - lVar4;
    lVar14 = lVar14 - lVar6;
LAB_001093a0:
    *(long *)((long)kinmem + 0x210) = lVar13;
    *(long *)((long)kinmem + 0x218) = lVar14;
LAB_001093a8:
    KINProcessError((KINMem)kinmem,-4,0x17a,"KINInit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                    ,"A memory request failed.");
    free(kinmem);
    return -4;
  }
LAB_00108dcc:
  if (*(long *)((long)kinmem + 0x138) == 0) {
    lVar4 = N_VClone(tmpl);
    *(long *)((long)kinmem + 0x138) = lVar4;
    if (lVar4 == 0) {
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
      lVar13 = *(long *)((long)kinmem + 0x210);
      lVar14 = *(long *)((long)kinmem + 0x218);
      lVar4 = *(long *)((long)kinmem + 0x200) * 2;
      lVar6 = *(long *)((long)kinmem + 0x208) * 2;
      goto LAB_0010939c;
    }
    *(long *)((long)kinmem + 0x210) =
         *(long *)((long)kinmem + 0x210) + *(long *)((long)kinmem + 0x200);
    *(long *)((long)kinmem + 0x218) =
         *(long *)((long)kinmem + 0x218) + *(long *)((long)kinmem + 0x208);
  }
  if (*(long *)((long)kinmem + 0x148) == 0) {
    lVar4 = N_VClone(tmpl);
    *(long *)((long)kinmem + 0x148) = lVar4;
    if (lVar4 != 0) {
      *(long *)((long)kinmem + 0x210) =
           *(long *)((long)kinmem + 0x210) + *(long *)((long)kinmem + 0x200);
      *(long *)((long)kinmem + 0x218) =
           *(long *)((long)kinmem + 0x218) + *(long *)((long)kinmem + 0x208);
      goto LAB_00108e48;
    }
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
    lVar11 = *(long *)((long)kinmem + 0x200);
    lVar12 = *(long *)((long)kinmem + 0x208);
    lVar13 = *(long *)((long)kinmem + 0x210);
    lVar14 = *(long *)((long)kinmem + 0x218);
    lVar4 = lVar11 * 2;
    lVar6 = lVar12 * 2;
LAB_0010934d:
    lVar13 = lVar13 - (lVar4 + lVar11);
    lVar14 = lVar14 - (lVar6 + lVar12);
    goto LAB_001093a0;
  }
LAB_00108e48:
  if (*(long *)((long)kinmem + 0x150) == 0) {
    lVar4 = N_VClone(tmpl);
    *(long *)((long)kinmem + 0x150) = lVar4;
    if (lVar4 == 0) {
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
      lVar13 = *(long *)((long)kinmem + 0x210);
      lVar14 = *(long *)((long)kinmem + 0x218);
      lVar4 = *(long *)((long)kinmem + 0x200) << 2;
      lVar6 = *(long *)((long)kinmem + 0x208) << 2;
      goto LAB_0010939c;
    }
    *(long *)((long)kinmem + 0x210) =
         *(long *)((long)kinmem + 0x210) + *(long *)((long)kinmem + 0x200);
    *(long *)((long)kinmem + 0x218) =
         *(long *)((long)kinmem + 0x218) + *(long *)((long)kinmem + 0x208);
  }
  lVar4 = *(long *)((long)kinmem + 0x1c0);
  if (lVar4 == 0) goto LAB_00109675;
  if (*(long *)((long)kinmem + 0x1a8) == 0) {
    pvVar5 = malloc(lVar4 * lVar4 * 8);
    *(void **)((long)kinmem + 0x1a8) = pvVar5;
    if (pvVar5 != (void *)0x0) goto LAB_00108ec0;
    KINProcessError((KINMem)kinmem,0,0x3a2,"KINAllocVectors",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                    ,"A memory request failed.");
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
    N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
LAB_0010964a:
    lVar4 = *(long *)((long)kinmem + 0x208) * -5;
    lVar6 = -5;
LAB_0010965f:
    *(long *)((long)kinmem + 0x218) = *(long *)((long)kinmem + 0x218) + lVar4;
    *(long *)((long)kinmem + 0x210) =
         *(long *)((long)kinmem + 0x210) + lVar6 * *(long *)((long)kinmem + 0x200);
  }
  else {
LAB_00108ec0:
    if (*(long *)((long)kinmem + 0x1a0) == 0) {
      pvVar5 = malloc(lVar4 * 8);
      *(void **)((long)kinmem + 0x1a0) = pvVar5;
      if (pvVar5 != (void *)0x0) goto LAB_00108ee7;
      KINProcessError((KINMem)kinmem,0,0x3b4,"KINAllocVectors",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                      ,"A memory request failed.");
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
      pvVar5 = *(void **)((long)kinmem + 0x1a8);
LAB_00109645:
      free(pvVar5);
      goto LAB_0010964a;
    }
LAB_00108ee7:
    if (*(long *)((long)kinmem + 0x1b8) == 0) {
      pvVar5 = malloc(lVar4 * 8);
      *(void **)((long)kinmem + 0x1b8) = pvVar5;
      if (pvVar5 == (void *)0x0) {
        KINProcessError((KINMem)kinmem,0,0x3c7,"KINAllocVectors",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                        ,"A memory request failed.");
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
        free(*(void **)((long)kinmem + 0x1a8));
        pvVar5 = *(void **)((long)kinmem + 0x1a0);
        goto LAB_00109645;
      }
    }
    if (*(long *)((long)kinmem + 0x1f0) == 0) {
      pvVar5 = malloc(lVar4 * 0x10 + 0x10);
      *(void **)((long)kinmem + 0x1f0) = pvVar5;
      if (pvVar5 == (void *)0x0) {
        KINProcessError((KINMem)kinmem,0,0x3db,"KINAllocVectors",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                        ,"A memory request failed.");
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
        free(*(void **)((long)kinmem + 0x1a8));
        free(*(void **)((long)kinmem + 0x1a0));
        pvVar5 = *(void **)((long)kinmem + 0x1b8);
        goto LAB_00109645;
      }
    }
    if (*(long *)((long)kinmem + 0x1f8) == 0) {
      pvVar5 = malloc(lVar4 * 0x10 + 0x10);
      *(void **)((long)kinmem + 0x1f8) = pvVar5;
      if (pvVar5 == (void *)0x0) {
        KINProcessError((KINMem)kinmem,0,0x3f0,"KINAllocVectors",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                        ,"A memory request failed.");
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
        free(*(void **)((long)kinmem + 0x1a8));
        free(*(void **)((long)kinmem + 0x1a0));
        free(*(void **)((long)kinmem + 0x1b8));
        pvVar5 = *(void **)((long)kinmem + 0x1f0);
        goto LAB_00109645;
      }
    }
    if (*(long *)((long)kinmem + 0x170) == 0) {
      lVar4 = N_VClone(tmpl);
      *(long *)((long)kinmem + 0x170) = lVar4;
      if (lVar4 == 0) {
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
        free(*(void **)((long)kinmem + 0x1a8));
        free(*(void **)((long)kinmem + 0x1a0));
        free(*(void **)((long)kinmem + 0x1b8));
        free(*(void **)((long)kinmem + 0x1f0));
        free(*(void **)((long)kinmem + 0x1f8));
        lVar11 = *(long *)((long)kinmem + 0x200);
        lVar12 = *(long *)((long)kinmem + 0x208);
        lVar13 = *(long *)((long)kinmem + 0x210);
        lVar14 = *(long *)((long)kinmem + 0x218);
        lVar4 = lVar11 << 2;
        lVar6 = lVar12 << 2;
        goto LAB_0010934d;
      }
      *(long *)((long)kinmem + 0x210) =
           *(long *)((long)kinmem + 0x210) + *(long *)((long)kinmem + 0x200);
      *(long *)((long)kinmem + 0x218) =
           *(long *)((long)kinmem + 0x218) + *(long *)((long)kinmem + 0x208);
    }
    if (*(long *)((long)kinmem + 0x178) == 0) {
      lVar4 = N_VClone(tmpl);
      *(long *)((long)kinmem + 0x178) = lVar4;
      if (lVar4 == 0) {
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
        free(*(void **)((long)kinmem + 0x1a8));
        free(*(void **)((long)kinmem + 0x1a0));
        free(*(void **)((long)kinmem + 0x1b8));
        free(*(void **)((long)kinmem + 0x1f0));
        free(*(void **)((long)kinmem + 0x1f8));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x170));
        uVar2 = *(ulong *)((long)kinmem + 0x200);
        uVar3 = *(ulong *)((long)kinmem + 0x208);
        lVar13 = ((uVar2 & 0xffffffff) * 0xffffffff + (uVar2 >> 0x20) * 0xfffffffa << 0x20) +
                 (uVar2 & 0xffffffff) * 0xfffffffa + *(long *)((long)kinmem + 0x210);
        lVar14 = ((uVar3 & 0xffffffff) * 0xffffffff + (uVar3 >> 0x20) * 0xfffffffa << 0x20) +
                 (uVar3 & 0xffffffff) * 0xfffffffa + *(long *)((long)kinmem + 0x218);
        goto LAB_001093a0;
      }
      *(long *)((long)kinmem + 0x210) =
           *(long *)((long)kinmem + 0x210) + *(long *)((long)kinmem + 0x200);
      *(long *)((long)kinmem + 0x218) =
           *(long *)((long)kinmem + 0x218) + *(long *)((long)kinmem + 0x208);
    }
    if (*(long *)((long)kinmem + 0x180) == 0) {
      lVar4 = N_VCloneVectorArray(*(undefined4 *)((long)kinmem + 0x1c0));
      *(long *)((long)kinmem + 0x180) = lVar4;
      if (lVar4 == 0) {
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
        free(*(void **)((long)kinmem + 0x1a8));
        free(*(void **)((long)kinmem + 0x1a0));
        free(*(void **)((long)kinmem + 0x1b8));
        free(*(void **)((long)kinmem + 0x1f0));
        free(*(void **)((long)kinmem + 0x1f8));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x170));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x178));
        *(long *)((long)kinmem + 0x210) =
             *(long *)((long)kinmem + 0x200) * -7 + *(long *)((long)kinmem + 0x210);
        *(long *)((long)kinmem + 0x218) =
             *(long *)((long)kinmem + 0x208) * -7 + *(long *)((long)kinmem + 0x218);
        goto LAB_001093a8;
      }
      *(long *)((long)kinmem + 0x218) =
           *(long *)((long)kinmem + 0x218) +
           *(long *)((long)kinmem + 0x208) * *(long *)((long)kinmem + 0x1c0);
      *(long *)((long)kinmem + 0x210) =
           *(long *)((long)kinmem + 0x210) +
           *(long *)((long)kinmem + 0x1c0) * *(long *)((long)kinmem + 0x200);
    }
    if (*(long *)((long)kinmem + 0x188) == 0) {
      lVar4 = N_VCloneVectorArray(*(undefined4 *)((long)kinmem + 0x1c0));
      *(long *)((long)kinmem + 0x188) = lVar4;
      if (lVar4 != 0) {
        *(long *)((long)kinmem + 0x218) =
             *(long *)((long)kinmem + 0x218) +
             *(long *)((long)kinmem + 0x208) * *(long *)((long)kinmem + 0x1c0);
        *(long *)((long)kinmem + 0x210) =
             *(long *)((long)kinmem + 0x210) +
             *(long *)((long)kinmem + 0x1c0) * *(long *)((long)kinmem + 0x200);
        goto LAB_0010907e;
      }
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
      free(*(void **)((long)kinmem + 0x1a8));
      free(*(void **)((long)kinmem + 0x1a0));
      free(*(void **)((long)kinmem + 0x1b8));
      free(*(void **)((long)kinmem + 0x1f0));
      free(*(void **)((long)kinmem + 0x1f8));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x170));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x178));
      N_VDestroyVectorArray
                (*(undefined8 *)((long)kinmem + 0x180),*(undefined4 *)((long)kinmem + 0x1c0));
      lVar4 = *(long *)((long)kinmem + 0x1c0);
LAB_00109b37:
      *(long *)((long)kinmem + 0x218) =
           *(long *)((long)kinmem + 0x218) - *(long *)((long)kinmem + 0x208) * (lVar4 + 7);
      *(long *)((long)kinmem + 0x210) =
           *(long *)((long)kinmem + 0x210) - (lVar4 + 7) * *(long *)((long)kinmem + 0x200);
      goto LAB_001093a8;
    }
LAB_0010907e:
    if (*(long *)((long)kinmem + 400) == 0) {
      lVar4 = N_VCloneVectorArray(*(undefined4 *)((long)kinmem + 0x1c0));
      *(long *)((long)kinmem + 400) = lVar4;
      if (lVar4 == 0) {
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
        free(*(void **)((long)kinmem + 0x1a8));
        free(*(void **)((long)kinmem + 0x1a0));
        free(*(void **)((long)kinmem + 0x1b8));
        free(*(void **)((long)kinmem + 0x1f0));
        free(*(void **)((long)kinmem + 0x1f8));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x170));
        N_VDestroy(*(undefined8 *)((long)kinmem + 0x178));
        N_VDestroyVectorArray
                  (*(undefined8 *)((long)kinmem + 0x180),*(undefined4 *)((long)kinmem + 0x1c0));
        N_VDestroyVectorArray
                  (*(undefined8 *)((long)kinmem + 0x188),*(undefined4 *)((long)kinmem + 0x1c0));
        lVar4 = *(long *)((long)kinmem + 0x1c0) * 2;
        goto LAB_00109b37;
      }
      *(long *)((long)kinmem + 0x218) =
           *(long *)((long)kinmem + 0x218) +
           *(long *)((long)kinmem + 0x208) * *(long *)((long)kinmem + 0x1c0);
      *(long *)((long)kinmem + 0x210) =
           *(long *)((long)kinmem + 0x210) +
           *(long *)((long)kinmem + 0x1c0) * *(long *)((long)kinmem + 0x200);
    }
    if (*(long *)((long)kinmem + 0x1e0) == 0) {
      pvVar5 = malloc(0x18);
      *(void **)((long)kinmem + 0x1e0) = pvVar5;
      if (pvVar5 != (void *)0x0) {
        *(long *)((long)kinmem + 0x218) =
             *(long *)((long)kinmem + 0x218) +
             *(long *)((long)kinmem + 0x208) * *(long *)((long)kinmem + 0x1c0);
        *(long *)((long)kinmem + 0x210) =
             *(long *)((long)kinmem + 0x210) +
             *(long *)((long)kinmem + 0x1c0) * *(long *)((long)kinmem + 0x200);
        goto LAB_0010911a;
      }
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
      free(*(void **)((long)kinmem + 0x1a8));
      free(*(void **)((long)kinmem + 0x1a0));
      free(*(void **)((long)kinmem + 0x1b8));
      free(*(void **)((long)kinmem + 0x1f0));
      free(*(void **)((long)kinmem + 0x1f8));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x170));
      N_VDestroy(*(undefined8 *)((long)kinmem + 0x178));
      N_VDestroyVectorArray
                (*(undefined8 *)((long)kinmem + 0x180),*(undefined4 *)((long)kinmem + 0x1c0));
      N_VDestroyVectorArray
                (*(undefined8 *)((long)kinmem + 0x188),*(undefined4 *)((long)kinmem + 0x1c0));
      N_VDestroyVectorArray
                (*(undefined8 *)((long)kinmem + 400),*(undefined4 *)((long)kinmem + 0x1c0));
      lVar4 = *(long *)((long)kinmem + 0x1c0);
      lVar6 = -7;
LAB_00109c35:
      lVar6 = lVar6 + lVar4 * -3;
      lVar4 = *(long *)((long)kinmem + 0x208) * lVar6;
      goto LAB_0010965f;
    }
LAB_0010911a:
    if (*(int *)((long)kinmem + 0x1d0) != 0) {
      if (*(long *)((long)kinmem + 0x158) == 0) {
        lVar4 = N_VClone(tmpl);
        *(long *)((long)kinmem + 0x158) = lVar4;
        if (lVar4 == 0) {
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
          free(*(void **)((long)kinmem + 0x1a8));
          free(*(void **)((long)kinmem + 0x1a0));
          free(*(void **)((long)kinmem + 0x1b8));
          free(*(void **)((long)kinmem + 0x1f0));
          free(*(void **)((long)kinmem + 0x1f8));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x170));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x178));
          N_VDestroyVectorArray
                    (*(undefined8 *)((long)kinmem + 0x180),*(undefined4 *)((long)kinmem + 0x1c0));
          N_VDestroyVectorArray
                    (*(undefined8 *)((long)kinmem + 0x188),*(undefined4 *)((long)kinmem + 0x1c0));
          N_VDestroyVectorArray
                    (*(undefined8 *)((long)kinmem + 400),*(undefined4 *)((long)kinmem + 0x1c0));
          free(*(void **)((long)kinmem + 0x1e0));
          lVar4 = *(long *)((long)kinmem + 0x1c0) * -3 + -7;
          *(long *)((long)kinmem + 0x218) =
               *(long *)((long)kinmem + 0x218) + *(long *)((long)kinmem + 0x208) * lVar4;
          *(long *)((long)kinmem + 0x210) =
               *(long *)((long)kinmem + 0x210) + lVar4 * *(long *)((long)kinmem + 0x200);
          goto LAB_001093a8;
        }
        *(long *)((long)kinmem + 0x210) =
             *(long *)((long)kinmem + 0x210) + *(long *)((long)kinmem + 0x200);
        *(long *)((long)kinmem + 0x218) =
             *(long *)((long)kinmem + 0x218) + *(long *)((long)kinmem + 0x208);
      }
      if ((*(int *)((long)kinmem + 0x1d0) == 1) && (*(long *)((long)kinmem + 0x1b0) == 0)) {
        pvVar5 = malloc(*(long *)((long)kinmem + 0x1c0) * *(long *)((long)kinmem + 0x1c0) * 8);
        *(void **)((long)kinmem + 0x1b0) = pvVar5;
        if (pvVar5 == (void *)0x0) {
          KINProcessError((KINMem)kinmem,0,0x4c0,"KINAllocVectors",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                          ,"A memory request failed.");
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x110));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x118));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x138));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x148));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x150));
          free(*(void **)((long)kinmem + 0x1a8));
          free(*(void **)((long)kinmem + 0x1a0));
          free(*(void **)((long)kinmem + 0x1b8));
          free(*(void **)((long)kinmem + 0x1f0));
          free(*(void **)((long)kinmem + 0x1f8));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x170));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x178));
          N_VDestroyVectorArray
                    (*(undefined8 *)((long)kinmem + 0x180),*(undefined4 *)((long)kinmem + 0x1c0));
          N_VDestroyVectorArray
                    (*(undefined8 *)((long)kinmem + 0x188),*(undefined4 *)((long)kinmem + 0x1c0));
          N_VDestroyVectorArray
                    (*(undefined8 *)((long)kinmem + 400),*(undefined4 *)((long)kinmem + 0x1c0));
          free(*(void **)((long)kinmem + 0x1e0));
          N_VDestroy(*(undefined8 *)((long)kinmem + 0x158));
          lVar4 = *(long *)((long)kinmem + 0x1c0);
          lVar6 = -8;
          goto LAB_00109c35;
        }
      }
    }
  }
LAB_00109675:
  *(KINSysFn *)((long)kinmem + 0x10) = func;
  *(undefined8 *)((long)kinmem + 0x248) = 0;
  *(undefined1 (*) [16])((long)kinmem + 0x220) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)kinmem + 0x230) = (undefined1  [16])0x0;
  if (*(long *)((long)kinmem + 0x1c0) == 0) goto switchD_001096ee_default;
  lVar4 = *(long *)((long)kinmem + 0x150);
  lVar6 = *(long *)(lVar4 + 8);
  if ((*(long *)(lVar6 + 0x140) == 0) && (*(long *)(lVar6 + 0x188) == 0)) {
    bVar10 = true;
  }
  else {
    bVar10 = *(long *)(lVar6 + 400) == 0;
  }
  switch(*(undefined4 *)((long)kinmem + 0x1d0)) {
  case 0:
    *(code **)((long)kinmem + 0x1d8) = SUNQRAdd_MGS;
    **(long **)((long)kinmem + 0x1e0) = lVar4;
    goto switchD_001096ee_default;
  case 1:
    if (bVar10) {
      pcVar7 = SUNQRAdd_ICWY;
    }
    else {
      pcVar7 = SUNQRAdd_ICWY_SB;
    }
    *(code **)((long)kinmem + 0x1d8) = pcVar7;
    plVar8 = *(long **)((long)kinmem + 0x1e0);
    *plVar8 = lVar4;
    plVar8[1] = *(long *)((long)kinmem + 0x158);
    lVar4 = *(long *)((long)kinmem + 0x1b0);
    goto LAB_0010978a;
  case 2:
    pcVar7 = SUNQRAdd_CGS2;
    break;
  case 3:
    if (bVar10) {
      pcVar7 = SUNQRAdd_DCGS2;
    }
    else {
      pcVar7 = SUNQRAdd_DCGS2_SB;
    }
    break;
  default:
    goto switchD_001096ee_default;
  }
  *(code **)((long)kinmem + 0x1d8) = pcVar7;
  plVar8 = *(long **)((long)kinmem + 0x1e0);
  *plVar8 = lVar4;
  plVar8[1] = *(long *)((long)kinmem + 0x158);
  lVar4 = *(long *)((long)kinmem + 0x1f0);
LAB_0010978a:
  plVar8[2] = lVar4;
switchD_001096ee_default:
  *(undefined4 *)((long)kinmem + 0x298) = 1;
  return 0;
}

Assistant:

int KINInit(void* kinmem, KINSysFn func, N_Vector tmpl)
{
  sunindextype liw1, lrw1;
  KINMem kin_mem;
  sunbooleantype allocOK, nvectorOK, dotprodSB;

  /* check kinmem */

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }
  kin_mem = (KINMem)kinmem;

  SUNDIALS_MARK_FUNCTION_BEGIN(KIN_PROFILER);

  if (func == NULL)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_FUNC_NULL);
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (KIN_ILL_INPUT);
  }

  /* check if all required vector operations are implemented */

  nvectorOK = KINCheckNvector(tmpl);
  if (!nvectorOK)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_NVECTOR);
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (KIN_ILL_INPUT);
  }

  /* set space requirements for one N_Vector */

  if (tmpl->ops->nvspace != NULL)
  {
    N_VSpace(tmpl, &lrw1, &liw1);
    kin_mem->kin_lrw1 = lrw1;
    kin_mem->kin_liw1 = liw1;
  }
  else
  {
    kin_mem->kin_lrw1 = 0;
    kin_mem->kin_liw1 = 0;
  }

  /* allocate necessary vectors */

  allocOK = KINAllocVectors(kin_mem, tmpl);
  if (!allocOK)
  {
    KINProcessError(kin_mem, KIN_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_MEM_FAIL);
    free(kin_mem);
    kin_mem = NULL;
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (KIN_MEM_FAIL);
  }

  /* copy the input parameter into KINSol state */

  kin_mem->kin_func = func;

  /* set the linear solver addresses to NULL */

  kin_mem->kin_linit  = NULL;
  kin_mem->kin_lsetup = NULL;
  kin_mem->kin_lsolve = NULL;
  kin_mem->kin_lfree  = NULL;
  kin_mem->kin_lmem   = NULL;

  /* initialize the QRData and set the QRAdd function if Anderson Acceleration is being used */
  if (kin_mem->kin_m_aa != 0)
  {
    dotprodSB = SUNFALSE;
    if ((kin_mem->kin_vtemp2->ops->nvdotprodlocal ||
         kin_mem->kin_vtemp2->ops->nvdotprodmultilocal) &&
        kin_mem->kin_vtemp2->ops->nvdotprodmultiallreduce)
    {
      dotprodSB = SUNTRUE;
    }

    if (kin_mem->kin_orth_aa == KIN_ORTH_MGS)
    {
      kin_mem->kin_qr_func        = (SUNQRAddFn)SUNQRAdd_MGS;
      kin_mem->kin_qr_data->vtemp = kin_mem->kin_vtemp2;
    }
    else if (kin_mem->kin_orth_aa == KIN_ORTH_ICWY)
    {
      if (dotprodSB) { kin_mem->kin_qr_func = (SUNQRAddFn)SUNQRAdd_ICWY_SB; }
      else { kin_mem->kin_qr_func = (SUNQRAddFn)SUNQRAdd_ICWY; }
      kin_mem->kin_qr_data->vtemp      = kin_mem->kin_vtemp2;
      kin_mem->kin_qr_data->vtemp2     = kin_mem->kin_vtemp3;
      kin_mem->kin_qr_data->temp_array = kin_mem->kin_T_aa;
    }
    else if (kin_mem->kin_orth_aa == KIN_ORTH_CGS2)
    {
      kin_mem->kin_qr_func             = (SUNQRAddFn)SUNQRAdd_CGS2;
      kin_mem->kin_qr_data->vtemp      = kin_mem->kin_vtemp2;
      kin_mem->kin_qr_data->vtemp2     = kin_mem->kin_vtemp3;
      kin_mem->kin_qr_data->temp_array = kin_mem->kin_cv;
    }
    else if (kin_mem->kin_orth_aa == KIN_ORTH_DCGS2)
    {
      if (dotprodSB) { kin_mem->kin_qr_func = (SUNQRAddFn)SUNQRAdd_DCGS2_SB; }
      else { kin_mem->kin_qr_func = (SUNQRAddFn)SUNQRAdd_DCGS2; }
      kin_mem->kin_qr_data->vtemp      = kin_mem->kin_vtemp2;
      kin_mem->kin_qr_data->vtemp2     = kin_mem->kin_vtemp3;
      kin_mem->kin_qr_data->temp_array = kin_mem->kin_cv;
    }
  }

  /* problem memory has been successfully allocated */

  kin_mem->kin_MallocDone = SUNTRUE;

  SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
  return (KIN_SUCCESS);
}